

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

int SearchColorNoIdx(uint32_t *sorted,uint32_t color,int num_colors)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int hi;
  int iVar4;
  
  iVar4 = 0;
  if (*sorted != color) {
    iVar3 = 0;
    do {
      iVar4 = num_colors + iVar3 >> 1;
      uVar1 = sorted[iVar4];
      iVar2 = iVar3;
      if (uVar1 < color) {
        iVar2 = iVar4;
      }
      if (uVar1 == color) {
        iVar2 = iVar3;
      }
      iVar3 = iVar2;
      if (color < uVar1) {
        num_colors = iVar4;
      }
    } while (uVar1 != color);
  }
  return iVar4;
}

Assistant:

int SearchColorNoIdx(const uint32_t sorted[], uint32_t color, int num_colors) {
  int low = 0, hi = num_colors;
  if (sorted[low] == color) return low;  // loop invariant: sorted[low] != color
  while (1) {
    const int mid = (low + hi) >> 1;
    if (sorted[mid] == color) {
      return mid;
    } else if (sorted[mid] < color) {
      low = mid;
    } else {
      hi = mid;
    }
  }
  assert(0);
  return 0;
}